

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O3

bool ImStb::STB_TEXTEDIT_INSERTCHARS
               (ImGuiInputTextState *obj,int pos,ImWchar *new_text,int new_text_len)

{
  int iVar1;
  unsigned_short *puVar2;
  int iVar3;
  unsigned_short *puVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  
  uVar6 = obj->UserFlags;
  iVar1 = obj->CurLenW;
  lVar9 = (long)new_text_len;
  iVar3 = ImTextCountUtf8BytesFromStr(new_text,new_text + lVar9);
  if ((uVar6 >> 0x12 & 1) == 0) {
    if ((obj->BufCapacityA <= obj->CurLenA + iVar3) || ((obj->TextW).Size <= new_text_len + iVar1))
    {
      return false;
    }
  }
  else if ((obj->TextW).Size <= new_text_len + iVar1) {
    uVar6 = 0x100;
    if (0x100 < (uint)new_text_len) {
      uVar6 = new_text_len;
    }
    if ((uint)(new_text_len * 4) < uVar6) {
      uVar6 = new_text_len * 4;
    }
    uVar5 = 0x20;
    if (7 < new_text_len) {
      uVar5 = uVar6;
    }
    iVar7 = uVar5 + iVar1 + 1;
    iVar8 = (obj->TextW).Capacity;
    if (iVar8 <= (int)(uVar5 + iVar1)) {
      if (iVar8 == 0) {
        iVar8 = 8;
      }
      else {
        iVar8 = iVar8 / 2 + iVar8;
      }
      if (iVar8 <= iVar7) {
        iVar8 = iVar7;
      }
      puVar4 = (unsigned_short *)ImGui::MemAlloc((long)iVar8 * 2);
      puVar2 = (obj->TextW).Data;
      if (puVar2 != (unsigned_short *)0x0) {
        memcpy(puVar4,puVar2,(long)(obj->TextW).Size * 2);
        ImGui::MemFree((obj->TextW).Data);
      }
      (obj->TextW).Data = puVar4;
      (obj->TextW).Capacity = iVar8;
    }
    (obj->TextW).Size = iVar7;
  }
  puVar2 = (obj->TextW).Data;
  if (iVar1 - pos != 0) {
    puVar4 = puVar2 + pos;
    memmove(puVar4 + lVar9,puVar4,(long)(iVar1 - pos) * 2);
  }
  memcpy(puVar2 + pos,new_text,lVar9 * 2);
  obj->Edited = true;
  lVar9 = obj->CurLenW + lVar9;
  obj->CurLenW = (int)lVar9;
  obj->CurLenA = obj->CurLenA + iVar3;
  (obj->TextW).Data[lVar9] = 0;
  return true;
}

Assistant:

static bool STB_TEXTEDIT_INSERTCHARS(STB_TEXTEDIT_STRING* obj, int pos, const ImWchar* new_text, int new_text_len)
{
    const bool is_resizable = (obj->UserFlags & ImGuiInputTextFlags_CallbackResize) != 0;
    const int text_len = obj->CurLenW;
    IM_ASSERT(pos <= text_len);

    const int new_text_len_utf8 = ImTextCountUtf8BytesFromStr(new_text, new_text + new_text_len);
    if (!is_resizable && (new_text_len_utf8 + obj->CurLenA + 1 > obj->BufCapacityA))
        return false;

    // Grow internal buffer if needed
    if (new_text_len + text_len + 1 > obj->TextW.Size)
    {
        if (!is_resizable)
            return false;
        IM_ASSERT(text_len < obj->TextW.Size);
        obj->TextW.resize(text_len + ImClamp(new_text_len * 4, 32, ImMax(256, new_text_len)) + 1);
    }

    ImWchar* text = obj->TextW.Data;
    if (pos != text_len)
        memmove(text + pos + new_text_len, text + pos, (size_t)(text_len - pos) * sizeof(ImWchar));
    memcpy(text + pos, new_text, (size_t)new_text_len * sizeof(ImWchar));

    obj->Edited = true;
    obj->CurLenW += new_text_len;
    obj->CurLenA += new_text_len_utf8;
    obj->TextW[obj->CurLenW] = '\0';

    return true;
}